

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::Formatter::ToString<unsigned_long,void>
          (string *__return_storage_ptr__,Formatter *this,unsigned_long x)

{
  AlphaNum *a;
  AlphaNum local_40;
  
  strings::AlphaNum::AlphaNum(&local_40,(unsigned_long)this);
  StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_40,a);
  return __return_storage_ptr__;
}

Assistant:

static std::string ToString(I x) {
    return StrCat(x);
  }